

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O0

Sexp * AnalyzeIf(Sexp *form)

{
  JetRuntimeException *this;
  Sexp *pSVar1;
  QuotedMeaning *this_00;
  ConditionalMeaning *this_01;
  Sexp **ppSVar2;
  ConditionalMeaning *meaning;
  string local_90 [32];
  tuple<bool&,unsigned_long&> local_70 [16];
  undefined1 local_60 [24];
  size_t len;
  Sexp *pSStack_40;
  bool is_proper;
  Sexp *false_branch;
  Sexp *true_branch;
  Sexp *cond;
  FrameProtector local_18;
  FrameProtector __frame_prot;
  Sexp *form_local;
  
  __frame_prot.protected_frame = (Frame *)form;
  FrameProtector::FrameProtector(&local_18,"AnalyzeIf");
  FrameProtector::ProtectValue(&local_18,(Sexp **)&__frame_prot,"form");
  true_branch = (Sexp *)0x0;
  FrameProtector::ProtectValue(&local_18,&true_branch,"cond");
  false_branch = (Sexp *)0x0;
  FrameProtector::ProtectValue(&local_18,&false_branch,"true_branch");
  pSStack_40 = (Sexp *)0x0;
  FrameProtector::ProtectValue(&local_18,&stack0xffffffffffffffc0,"false_branch");
  Sexp::Length((Sexp *)local_60);
  std::tie<bool,unsigned_long>((bool *)local_70,(unsigned_long *)((long)&len + 7));
  std::tuple<bool&,unsigned_long&>::operator=(local_70,(tuple<bool,_unsigned_long> *)local_60);
  if ((((len._7_1_ & 1) != 0) && ((Sexp *)0x1 < (ulong)local_60._16_8_)) &&
     ((ulong)local_60._16_8_ < (Sexp *)0x4)) {
    pSVar1 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
    true_branch = Analyze(pSVar1);
    pSVar1 = Sexp::Cadr((Sexp *)__frame_prot.protected_frame);
    false_branch = Analyze(pSVar1);
    if ((Sexp *)local_60._16_8_ == (Sexp *)0x3) {
      pSVar1 = Sexp::Caddr((Sexp *)__frame_prot.protected_frame);
      pSStack_40 = Analyze(pSVar1);
    }
    else if ((Sexp *)local_60._16_8_ == (Sexp *)0x2) {
      this_00 = (QuotedMeaning *)operator_new(0x10);
      pSVar1 = GcHeap::AllocateEmpty();
      QuotedMeaning::QuotedMeaning(this_00,pSVar1);
      pSStack_40 = GcHeap::AllocateMeaning((Meaning *)this_00);
    }
    this_01 = (ConditionalMeaning *)operator_new(0x20);
    ConditionalMeaning::ConditionalMeaning(this_01,true_branch,false_branch,pSStack_40);
    ppSVar2 = ConditionalMeaning::Condition(this_01);
    FrameProtector::ProtectValue(&local_18,ppSVar2,"meaning->Condition()");
    ppSVar2 = ConditionalMeaning::TrueBranch(this_01);
    FrameProtector::ProtectValue(&local_18,ppSVar2,"meaning->TrueBranch()");
    ppSVar2 = ConditionalMeaning::FalseBranch(this_01);
    FrameProtector::ProtectValue(&local_18,ppSVar2,"meaning->FalseBranch()");
    pSVar1 = GcHeap::AllocateMeaning((Meaning *)this_01);
    FrameProtector::~FrameProtector(&local_18);
    return pSVar1;
  }
  meaning._6_1_ = 1;
  this = (JetRuntimeException *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"invalid if form",(allocator *)((long)&meaning + 7));
  JetRuntimeException::JetRuntimeException(this,(string *)local_90);
  meaning._6_1_ = 0;
  __cxa_throw(this,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

static Sexp *AnalyzeIf(Sexp *form) {
  GC_HELPER_FRAME;
  GC_PROTECT(form);
  GC_PROTECTED_LOCAL(cond);
  GC_PROTECTED_LOCAL(true_branch);
  GC_PROTECTED_LOCAL(false_branch);

  bool is_proper;
  size_t len;
  std::tie(is_proper, len) = form->Length();
  if (!is_proper || len < 2 || len > 3) {
    throw JetRuntimeException("invalid if form");
  }

  cond = Analyze(form->Car());
  true_branch = Analyze(form->Cadr());

  if (len == 3) {
    false_branch = Analyze(form->Caddr());
  } else if (len == 2) {
    // this is questionable and goes against
    // the guidance earlier in the file about protecting
    // meanings, but this is safe because we are quoting
    // the empty list, which doesn't get relocated.
    false_branch =
        GcHeap::AllocateMeaning(new QuotedMeaning(GcHeap::AllocateEmpty()));
  }

  ConditionalMeaning *meaning =
      new ConditionalMeaning(cond, true_branch, false_branch);
  GC_PROTECT(meaning->Condition());
  GC_PROTECT(meaning->TrueBranch());
  GC_PROTECT(meaning->FalseBranch());
  return GcHeap::AllocateMeaning(meaning);
}